

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

Expression *
slang::ast::tryBindSpecialMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  RandMode RVar2;
  Symbol *this;
  Expression *pEVar3;
  Compilation *compilation_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view methodName;
  
  this = Expression::getSymbolReference(expr,true);
  if (this == (Symbol *)0x0) {
LAB_0063e89f:
    pEVar3 = (Expression *)0x0;
  }
  else {
    __x._M_len = (selector->name)._M_len;
    __x._M_str = (selector->name)._M_str;
    __y._M_str = "rand_mode";
    __y._M_len = 9;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      RVar2 = Symbol::getRandMode(this);
      if (RVar2 == None) goto LAB_0063e89f;
      compilation_00 = (Compilation *)0x3f;
    }
    else {
      compilation_00 = (Compilation *)(ulong)this->kind;
    }
    methodName._M_str = (char *)invocation;
    methodName._M_len = (size_t)(selector->name)._M_str;
    pEVar3 = CallExpression::fromBuiltInMethod
                       ((CallExpression *)compilation,compilation_00,(SymbolKind)expr,
                        (Expression *)(selector->name)._M_len,methodName,
                        (InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,(ASTContext *)withClause);
  }
  return pEVar3;
}

Assistant:

static Expression* tryBindSpecialMethod(Compilation& compilation, const Expression& expr,
                                        const LookupResult::MemberSelector& selector,
                                        const InvocationExpressionSyntax* invocation,
                                        const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                        const ASTContext& context) {
    auto sym = expr.getSymbolReference();
    if (!sym)
        return nullptr;

    // There is a built-in 'rand_mode' method that is present on every 'rand' and 'randc'
    // class property, and additionally on subelements of those properties.
    if (selector.name == "rand_mode"sv) {
        if (sym->getRandMode() == RandMode::None)
            return nullptr;

        return CallExpression::fromBuiltInMethod(compilation, SymbolKind::ClassProperty, expr,
                                                 selector.name, invocation, withClause, context);
    }

    return CallExpression::fromBuiltInMethod(compilation, sym->kind, expr, selector.name,
                                             invocation, withClause, context);
}